

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.cpp
# Opt level: O3

token * __thiscall argo::pointer::make_token(token *__return_storage_ptr__,pointer *this,string *s)

{
  pointer pcVar1;
  istream *piVar2;
  size_t i;
  istringstream is;
  size_t local_1a0;
  istringstream local_198 [120];
  ios_base local_120 [264];
  
  std::__cxx11::istringstream::istringstream(local_198,(string *)s,_S_in);
  piVar2 = std::istream::_M_extract<unsigned_long>((ulong *)local_198);
  if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
    __return_storage_ptr__->m_type = array_e;
    (__return_storage_ptr__->m_name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_name).field_2;
    (__return_storage_ptr__->m_name)._M_string_length = 0;
    (__return_storage_ptr__->m_name).field_2._M_local_buf[0] = '\0';
  }
  else {
    __return_storage_ptr__->m_type = object_e;
    (__return_storage_ptr__->m_name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_name).field_2;
    pcVar1 = (s->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_name,pcVar1,pcVar1 + s->_M_string_length);
    local_1a0 = 0;
  }
  __return_storage_ptr__->m_index = local_1a0;
  std::__cxx11::istringstream::~istringstream(local_198);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

pointer::token pointer::make_token(const string &s)
{
    istringstream is(s);

    size_t i;

    if (is >> i)
    {
        return token(i);
    }
    else
    {
        return token(s);
    }
}